

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

int __thiscall
CTPNSymDebugLocal::gen_code_asi
          (CTPNSymDebugLocal *this,int discard,int phase,tc_asitype_t typ,char *param_5,
          CTcPrsNode *rhs,int param_7,int param_8,void **param_9)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  CTcDataStream *in_R9;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  uint uVar1;
  int local_4;
  
  if ((in_ECX == 0) || (in_EDX == 2)) {
    if (in_R9 != (CTcDataStream *)0x0) {
      (**in_R9->_vptr_CTcDataStream)(in_R9,0);
    }
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      CTcGenTarg::note_push((CTcGenTarg *)0x281137);
    }
    if (*(int *)((long)in_RDI + 0xc) == 0) {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      uVar1 = (uint)((ulong)in_RDI >> 0x20);
      CTcDataStream::write2(in_R9,uVar1);
      CTcDataStream::write2(in_R9,uVar1);
    }
    else {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      uVar1 = (uint)((ulong)in_RDI >> 0x20);
      CTcDataStream::write2(in_R9,uVar1);
      CTcDataStream::write2(in_R9,uVar1);
      CTPNConst::s_gen_code_int(0x2811ed);
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      CTcGenTarg::note_pop(G_cg,3);
    }
    CTcGenTarg::note_pop((CTcGenTarg *)0x281238);
    local_4 = 1;
  }
  else if (in_EDX == 1) {
    (**(code **)*in_RDI)(in_RDI,0);
    local_4 = 0;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTPNSymDebugLocal::gen_code_asi(int discard, int phase,
                                    tc_asitype_t typ, const char *,
                                    CTcPrsNode *rhs,
                                    int, int, void **)
{
    /* check what we're doing */
    if (typ == TC_ASI_SIMPLE || phase == 2)
    {        
        /* 
         *   Simple assignment, or phase 2 of a compound assignment.  In
         *   either case, just assign the rvalue to the variable.  
         */
        if (rhs != 0)
            rhs->gen_code(FALSE, FALSE);

        /* 
         *   if we're not discarding the result, duplicate the value so we'll
         *   have a copy after the assignment 
         */
        if (!discard)
        {
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();
        }
        
        /* check for a context property */
        if (ctx_arr_idx_ == 0)
        {
            /* 
             *   generate the debug-local-set instruction - the operands are
             *   the variable number and the stack frame index 
             */
            G_cg->write_op(is_param_ ? OPC_SETDBARG : OPC_SETDBLCL);
            G_cs->write2(var_id_);
            G_cs->write2(frame_idx_);
        }
        else
        {
            /* get the local containing our context object */
            G_cg->write_op(OPC_GETDBLCL);
            G_cs->write2(var_id_);
            G_cs->write2(frame_idx_);
            
            /* set the actual variable value in the context object */
            CTPNConst::s_gen_code_int(ctx_arr_idx_);
            G_cg->write_op(OPC_SETIND);
            G_cg->write_op(OPC_DISC);
            
            /* 
             *   we did three pops (SETIND), then a push (SETIND), then a pop
             *   (DISC) - this is a net of three extra pops 
             */
            G_cg->note_pop(3);
        }
        
        /* the debug-local-set removes the rvalue from the stack */
        G_cg->note_pop();
        
        /* handled */
        return TRUE;
    }
    else if (phase == 1)
    {
        /* 
         *   Compound assignment, phase 1.  Simply generate our value and let
         *   the caller proceed with the generic combination operator. 
         */
        gen_code(FALSE, FALSE);
        return FALSE;
    }
    else
    {
        /* ignore other phases */
        return FALSE;
    }
}